

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::ImageSizeMachine::GenShader<tcu::Vector<unsigned_int,4>>
          (string *__return_storage_ptr__,ImageSizeMachine *this,int stage,bool ms_and_1d,
          bool subroutine)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  char cVar5;
  ostringstream os;
  char local_358 [16];
  char *local_348;
  undefined8 local_340;
  undefined2 local_338;
  undefined1 uStack_336;
  undefined5 uStack_335;
  char *local_328;
  undefined8 local_320;
  undefined2 local_318;
  undefined6 uStack_316;
  char *local_308;
  undefined8 local_300;
  undefined2 local_2f8;
  undefined1 uStack_2f6;
  undefined5 uStack_2f5;
  char *local_2e8;
  undefined8 local_2e0;
  undefined2 local_2d8;
  undefined6 uStack_2d6;
  char *local_2c8;
  undefined8 local_2c0;
  undefined2 local_2b8;
  undefined1 uStack_2b6;
  undefined5 uStack_2b5;
  char *local_2a8;
  undefined8 local_2a0;
  undefined2 local_298;
  undefined6 uStack_296;
  char *local_288;
  undefined8 local_280;
  undefined2 local_278;
  undefined1 uStack_276;
  undefined5 uStack_275;
  char *local_268;
  undefined8 local_260;
  undefined2 local_258;
  undefined6 uStack_256;
  char *local_248;
  undefined8 local_240;
  undefined2 local_238;
  undefined1 uStack_236;
  undefined5 uStack_235;
  char *local_228;
  undefined8 local_220;
  undefined2 local_218;
  undefined6 uStack_216;
  char *local_208;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined1 uStack_1f6;
  undefined5 uStack_1f5;
  char *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined6 uStack_1d6;
  char *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined1 uStack_1b6;
  undefined5 uStack_1b5;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 430 core",0x11);
  uVar4 = (uint)this;
  if (uVar4 == 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n#extension GL_ARB_compute_shader : require",0x2b);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\nlayout(binding = 0, rgba32i) writeonly uniform iimage2D g_result;",0x42);
  cVar5 = (char)stage;
  if (cVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(binding = 1, rgba32",0x1b);
    local_2c8 = (char *)&local_2b8;
    local_2b8 = 0x6975;
    local_2c0 = 2;
    uStack_2b6 = 0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_2c8,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_2e8 = (char *)&local_2d8;
    local_2d8 = 0x75;
    local_2e0 = 1;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2e8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"image2D g_image_2d;\nlayout(binding = 2, rgba32",0x2e);
    local_308 = (char *)&local_2f8;
    local_2f8 = 0x6975;
    local_300 = 2;
    uStack_2f6 = 0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_308,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_328 = (char *)&local_318;
    local_318 = 0x75;
    local_320 = 1;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_328,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"image3D g_image_3d;\nlayout(binding = 3, rgba32",0x2e);
    local_348 = (char *)&local_338;
    local_338 = 0x6975;
    local_340 = 2;
    uStack_336 = 0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_348,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_358[0] = 'u';
    local_358[1] = '\0';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_358,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"imageCube g_image_cube;\nlayout(binding = 4, rgba32",0x32);
    local_288 = (char *)&local_278;
    local_278 = 0x6975;
    local_280 = 2;
    uStack_276 = 0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_288,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_2a8 = (char *)&local_298;
    local_298 = 0x75;
    local_2a0 = 1;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"imageCubeArray g_image_cube_array;\nlayout(binding = 5, rgba32",0x3d);
    local_248 = (char *)&local_238;
    local_238 = 0x6975;
    local_240 = 2;
    uStack_236 = 0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_248,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_268 = (char *)&local_258;
    local_258 = 0x75;
    local_260 = 1;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_268,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"image2DRect g_image_rect;\nlayout(binding = 6, rgba32",0x34);
    local_1b8 = 0x6975;
    local_1c0 = 2;
    uStack_1b6 = 0;
    local_1c8 = (char *)&local_1b8;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1b8,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_1d8 = 0x75;
    local_1e0 = 1;
    local_1e8 = (char *)&local_1d8;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1d8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"image2DArray g_image_2d_array;\nlayout(binding = 7, rgba32",0x39);
    local_1f8 = 0x6975;
    local_200 = 2;
    uStack_1f6 = 0;
    local_208 = (char *)&local_1f8;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1f8,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_218 = 0x75;
    local_220 = 1;
    local_228 = (char *)&local_218;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_218,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"imageBuffer g_image_buffer;",0x1b);
    if (local_228 != (char *)&local_218) {
      operator_delete(local_228,CONCAT62(uStack_216,local_218) + 1);
    }
    if (local_208 != (char *)&local_1f8) {
      operator_delete(local_208,CONCAT53(uStack_1f5,CONCAT12(uStack_1f6,local_1f8)) + 1);
    }
    if (local_1e8 != (char *)&local_1d8) {
      operator_delete(local_1e8,CONCAT62(uStack_1d6,local_1d8) + 1);
    }
    if (local_1c8 != (char *)&local_1b8) {
      operator_delete(local_1c8,CONCAT53(uStack_1b5,CONCAT12(uStack_1b6,local_1b8)) + 1);
    }
    if (local_268 != (char *)&local_258) {
      operator_delete(local_268,CONCAT62(uStack_256,local_258) + 1);
    }
    if (local_248 != (char *)&local_238) {
      operator_delete(local_248,CONCAT53(uStack_235,CONCAT12(uStack_236,local_238)) + 1);
    }
    if (local_2a8 != (char *)&local_298) {
      operator_delete(local_2a8,CONCAT62(uStack_296,local_298) + 1);
    }
    if (local_288 != (char *)&local_278) goto LAB_00a155b3;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(binding = 1, rgba32",0x1b);
    local_2c8 = (char *)&local_2b8;
    local_2b8 = 0x6975;
    local_2c0 = 2;
    uStack_2b6 = 0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_2c8,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_2e8 = (char *)&local_2d8;
    local_2d8 = 0x75;
    local_2e0 = 1;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2e8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"image1D g_image_1d;\nlayout(binding = 2, rgba32",0x2e);
    local_308 = (char *)&local_2f8;
    local_2f8 = 0x6975;
    local_300 = 2;
    uStack_2f6 = 0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_308,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_328 = (char *)&local_318;
    local_318 = 0x75;
    local_320 = 1;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_328,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"image1DArray g_image_1d_array;\nlayout(binding = 3, rgba32",0x39);
    local_348 = (char *)&local_338;
    local_338 = 0x6975;
    local_340 = 2;
    uStack_336 = 0;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_348,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_358[0] = 'u';
    local_358[1] = '\0';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_358,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"image2DMS g_image_2dms;\nlayout(binding = 4, rgba32",0x32);
    local_278 = 0x6975;
    local_280 = 2;
    uStack_276 = 0;
    local_288 = (char *)&local_278;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_278,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") uniform ",10);
    local_298 = 0x75;
    local_2a0 = 1;
    local_2a8 = (char *)&local_298;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_298,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"image2DMSArray g_image_2dms_array;",0x22);
    if (local_2a8 != (char *)&local_298) {
      operator_delete(local_2a8,CONCAT62(uStack_296,local_298) + 1);
    }
    if (local_288 != (char *)&local_278) {
LAB_00a155b3:
      operator_delete(local_288,CONCAT53(uStack_275,CONCAT12(uStack_276,local_278)) + 1);
    }
  }
  if (local_348 != (char *)&local_338) {
    operator_delete(local_348,CONCAT53(uStack_335,CONCAT12(uStack_336,local_338)) + 1);
  }
  if (local_328 != (char *)&local_318) {
    operator_delete(local_328,CONCAT62(uStack_316,local_318) + 1);
  }
  if (local_308 != (char *)&local_2f8) {
    operator_delete(local_308,CONCAT53(uStack_2f5,CONCAT12(uStack_2f6,local_2f8)) + 1);
  }
  if (local_2e8 != (char *)&local_2d8) {
    operator_delete(local_2e8,CONCAT62(uStack_2d6,local_2d8) + 1);
  }
  if (local_2c8 != (char *)&local_2b8) {
    operator_delete(local_2c8,CONCAT53(uStack_2b5,CONCAT12(uStack_2b6,local_2b8)) + 1);
  }
  if (ms_and_1d) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\nsubroutine void FuncType(int coord);\nsubroutine uniform FuncType g_func;",0x49);
  }
  if (uVar4 < 4) {
    pcVar3 = (&PTR_anon_var_dwarf_63ed5f_02126308)[(ulong)this & 0xffffffff];
    lVar2 = *(long *)(&DAT_01adc8f8 + ((ulong)this & 0xffffffff) * 8);
  }
  else if (uVar4 == 4) {
    lVar2 = 0x57;
    pcVar3 = 
    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  int coord = int(gl_GlobalInvocationID.x);";
  }
  else {
    if (uVar4 != 5) goto LAB_00a15bab;
    lVar2 = 0x2c;
    pcVar3 = "\nvoid main() {\n  int coord = gl_PrimitiveID;";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,lVar2);
LAB_00a15bab:
  if (ms_and_1d) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\n  g_func(coord);\n}\nsubroutine(FuncType) void Func0(int coord) {",0x40);
  }
  pcVar3 = 
  "\n  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_2d), 0, 0));\n  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_3d), 0));\n  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_cube), 0, 0));\n  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_cube_array), 0));\n  imageStore(g_result, ivec2(coord, 4), ivec4(imageSize(g_image_rect), 0, 0));\n  imageStore(g_result, ivec2(coord, 5), ivec4(imageSize(g_image_2d_array), 0));\n  imageStore(g_result, ivec2(coord, 6), ivec4(imageSize(g_image_buffer), 0, 0, 0));\n}"
  ;
  if (cVar5 != '\0') {
    pcVar3 = 
    "\n  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_1d), 0, 0, 0));\n  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_1d_array), 0, 0));\n  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_2dms), 0, 0));\n  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_2dms_array), 0));\n  imageStore(g_result, ivec2(coord, 4), ivec4(0));\n  imageStore(g_result, ivec2(coord, 5), ivec4(0));\n  imageStore(g_result, ivec2(coord, 6), ivec4(0));\n}"
    ;
  }
  lVar2 = 0x22d;
  if (cVar5 != '\0') {
    lVar2 = 0x1df;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,lVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GenShader(int stage, bool ms_and_1d, bool subroutine)
	{
		std::ostringstream os;
		os << "#version 430 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(binding = 0, rgba32i) writeonly uniform iimage2D g_result;";
		if (ms_and_1d == false)
		{
			os << NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2D g_image_2d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image3D g_image_3d;" NL "layout(binding = 3, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "imageCube g_image_cube;" NL "layout(binding = 4, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "imageCubeArray g_image_cube_array;" NL "layout(binding = 5, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2DRect g_image_rect;" NL "layout(binding = 6, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image2DArray g_image_2d_array;" NL "layout(binding = 7, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>() << "imageBuffer g_image_buffer;";
		}
		else
		{
			os << NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image1D g_image_1d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image1DArray g_image_1d_array;" NL "layout(binding = 3, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2DMS g_image_2dms;" NL "layout(binding = 4, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image2DMSArray g_image_2dms_array;";
		}
		if (subroutine)
		{
			os << NL "subroutine void FuncType(int coord);" NL "subroutine uniform FuncType g_func;";
		}
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  int coord = gl_VertexID;";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL "  int coord = gl_PrimitiveID;";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL "  int coord = gl_PrimitiveID;";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  int coord = gl_PrimitiveIDIn;";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL "  int coord = int(gl_GlobalInvocationID.x);";
		}
		else if (stage == 5)
		{ // FS
			os << NL "void main() {" NL "  int coord = gl_PrimitiveID;";
		}
		if (subroutine)
		{
			os << NL "  g_func(coord);" NL "}" NL "subroutine(FuncType) void Func0(int coord) {";
		}
		if (ms_and_1d == false)
		{
			os << NL "  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_2d), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_3d), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_cube), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_cube_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 4), ivec4(imageSize(g_image_rect), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 5), ivec4(imageSize(g_image_2d_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 6), ivec4(imageSize(g_image_buffer), 0, 0, 0));" NL "}";
		}
		else
		{
			os << NL "  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_1d), 0, 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_1d_array), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_2dms), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_2dms_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 4), ivec4(0));" NL
					 "  imageStore(g_result, ivec2(coord, 5), ivec4(0));" NL
					 "  imageStore(g_result, ivec2(coord, 6), ivec4(0));" NL "}";
		}
		return os.str();
	}